

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O1

void * ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  u_char uVar1;
  size_t sVar2;
  void *pvVar3;
  ngx_uint_t key;
  void *pvVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = len == 0;
  sVar5 = len;
  if (!bVar6) {
    uVar1 = name[len - 1];
    while (uVar1 != '.') {
      bVar6 = sVar5 == 1;
      if (bVar6) {
        sVar5 = 0;
        break;
      }
      uVar1 = name[sVar5 - 2];
      sVar5 = sVar5 - 1;
    }
  }
  key = 0;
  sVar2 = sVar5;
  if (sVar5 <= len && len - sVar5 != 0) {
    do {
      key = (ulong)name[sVar2] + key * 0x1f;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  pvVar3 = ngx_hash_find(&hwc->hash,key,name + sVar5,len - sVar5);
  if (pvVar3 == (void *)0x0) {
    pvVar4 = hwc->value;
  }
  else if (((ulong)pvVar3 & 2) == 0) {
    bVar7 = ((ulong)pvVar3 & 1) == 0;
    pvVar4 = (void *)0x0;
    if (bVar7) {
      pvVar4 = pvVar3;
    }
    if (!(bool)(bVar6 | bVar7)) {
      pvVar4 = (void *)((ulong)pvVar3 & 0xfffffffffffffffc);
    }
  }
  else {
    if (bVar6) {
      if (((ulong)pvVar3 & 1) != 0) {
        return (void *)0x0;
      }
    }
    else {
      pvVar4 = ngx_hash_find_wc_head
                         ((ngx_hash_wildcard_t *)((ulong)pvVar3 & 0xfffffffffffffffc),name,sVar5 - 1
                         );
      if (pvVar4 != (void *)0x0) {
        return pvVar4;
      }
    }
    pvVar4 = *(void **)(((ulong)pvVar3 & 0xfffffffffffffffc) + 0x10);
  }
  return pvVar4;
}

Assistant:

void *
ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, n, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wch:\"%*s\"", len, name);
#endif

    n = len;

    while (n) {
        if (name[n - 1] == '.') {
            break;
        }

        n--;
    }

    key = 0;

    for (i = n; i < len; i++) {
        key = ngx_hash(key, name[i]);
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, &name[n], len - n);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer for both "example.com"
         *          and "*.example.com";
         *     01 - value is data pointer for "*.example.com" only;
         *     10 - value is pointer to wildcard hash allowing
         *          both "example.com" and "*.example.com";
         *     11 - value is pointer to wildcard hash allowing
         *          "*.example.com" only.
         */

        if ((uintptr_t) value & 2) {

            if (n == 0) {

                /* "example.com" */

                if ((uintptr_t) value & 1) {
                    return NULL;
                }

                hwc = (ngx_hash_wildcard_t *)
                                          ((uintptr_t) value & (uintptr_t) ~3);
                return hwc->value;
            }

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_head(hwc, name, n - 1);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        if ((uintptr_t) value & 1) {

            if (n == 0) {

                /* "example.com" */

                return NULL;
            }

            return (void *) ((uintptr_t) value & (uintptr_t) ~3);
        }

        return value;
    }

    return hwc->value;
}